

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O2

type jsoncons::binary::
     native_to_big<int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
               (int val,back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        d_first)

{
  long lVar1;
  uint8_t buf [4];
  uint8_t local_14 [4];
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
              (d_first.container,local_14[lVar1]);
  }
  return;
}

Assistant:

typename std::enable_if<Endian::native == Endian::little,void>::type
    native_to_big(T val, OutputIt d_first)
    {
        T val2 = byte_swap(val);
        uint8_t buf[sizeof(T)];
        std::memcpy(buf, &val2, sizeof(T));
        for (auto item : buf)
        {
            *d_first++ = item;
        }
    }